

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase133::run(TestCase133 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  Orphan<capnp::Text> *value;
  ReaderFor<capnp::Text> RVar2;
  Builder local_310;
  bool local_2f1;
  undefined1 local_2f0 [7];
  bool _kj_shouldLog_7;
  char (*local_2d8) [4];
  undefined1 local_2d0 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_7;
  bool _kj_shouldLog_6;
  DebugExpression<bool> _kjCondition_6;
  void *pvStack_290;
  bool _kj_shouldLog_5;
  Orphan<capnp::Text> *local_288;
  undefined1 local_280 [8];
  DebugComparison<capnp::Orphan<capnp::Text>_&,_std::nullptr_t> _kjCondition_5;
  undefined1 local_250 [5];
  bool _kj_shouldLog_4;
  DebugExpression<bool> _kjCondition_4;
  bool local_231;
  undefined1 local_230 [7];
  bool _kj_shouldLog_3;
  char (*local_218) [4];
  undefined1 local_210 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_3;
  bool local_1c1;
  undefined1 auStack_1c0 [7];
  bool _kj_shouldLog_2;
  size_t local_1b8;
  char (*local_1b0) [4];
  undefined1 local_1a8 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_2;
  undefined1 local_170 [5];
  bool _kj_shouldLog_1;
  DebugExpression<bool> _kjCondition_1;
  Orphan<capnp::Text> orphan;
  undefined1 auStack_148 [5];
  bool _kj_shouldLog;
  DebugExpression<bool> _kjCondition;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase133 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  Text::Reader::Reader((Reader *)auStack_148,"foo");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField
            ((Builder *)local_128,(Reader)_auStack_148);
  orphan.builder.location._6_1_ =
       capnproto_test::capnp::test::TestAllTypes::Builder::hasTextField((Builder *)local_128);
  orphan.builder.location._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                  (bool *)((long)&orphan.builder.location + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)((long)&orphan.builder.location + 7));
  if (!bVar1) {
    orphan.builder.location._5_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)orphan.builder.location._5_1_ != false) {
      kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x8a,ERROR,"\"failed: expected \" \"root.hasTextField()\", _kjCondition",
                 (char (*) [37])"failed: expected root.hasTextField()",
                 (DebugExpression<bool> *)((long)&orphan.builder.location + 7));
      orphan.builder.location._5_1_ = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::disownTextField
            ((Orphan<capnp::Text> *)local_170,(Builder *)local_128);
  bVar1 = Orphan<capnp::Text>::operator==((Orphan<capnp::Text> *)local_170,(void *)0x0);
  _kjCondition_2._46_1_ = ~bVar1 & 1;
  _kjCondition_2._47_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_2.field_0x2e);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_2.field_0x2f);
  if (!bVar1) {
    _kjCondition_2._45_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._45_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x8d,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\", _kjCondition",
                 (char (*) [38])"failed: expected !(orphan == nullptr)",
                 (DebugExpression<bool> *)&_kjCondition_2.field_0x2f);
      _kjCondition_2._45_1_ = 0;
    }
  }
  local_1b0 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  _auStack_1c0 = (ArrayPtr<const_char>)
                 Orphan<capnp::Text>::getReader((Orphan<capnp::Text> *)local_170);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_1a8,
             (DebugExpression<char_const(&)[4]> *)&local_1b0,(Reader *)auStack_1c0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a8);
  if (!bVar1) {
    local_1c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1c1 != false) {
      RVar2 = Orphan<capnp::Text>::getReader((Orphan<capnp::Text> *)local_170);
      _kjCondition_3._48_8_ = RVar2.super_StringPtr.content.ptr;
      kj::_::Debug::
      log<char_const(&)[49],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x8f,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (orphan.getReader())\", _kjCondition, \"foo\", orphan.getReader()"
                 ,(char (*) [49])"failed: expected (\"foo\") == (orphan.getReader())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_1a8,
                 (char (*) [4])"foo",(Reader *)&_kjCondition_3.result);
      local_1c1 = false;
    }
  }
  local_218 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  Orphan<capnp::Text>::get((BuilderFor<capnp::Text> *)local_230,(Orphan<capnp::Text> *)local_170);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_210,
             (DebugExpression<char_const(&)[4]> *)&local_218,(Builder *)local_230);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_210);
  if (!bVar1) {
    local_231 = kj::_::Debug::shouldLog(ERROR);
    while (local_231 != false) {
      Orphan<capnp::Text>::get
                ((BuilderFor<capnp::Text> *)local_250,(Orphan<capnp::Text> *)local_170);
      kj::_::Debug::
      log<char_const(&)[43],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x90,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (orphan.get())\", _kjCondition, \"foo\", orphan.get()"
                 ,(char (*) [43])"failed: expected (\"foo\") == (orphan.get())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_210,
                 (char (*) [4])"foo",(Builder *)local_250);
      local_231 = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextField((Builder *)local_128);
  _kjCondition_5._38_1_ = ~bVar1 & 1;
  _kjCondition_5._39_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_5.field_0x26);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_5.field_0x27);
  if (!bVar1) {
    _kjCondition_5._37_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_5._37_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x91,ERROR,"\"failed: expected \" \"!(root.hasTextField())\", _kjCondition",
                 (char (*) [40])"failed: expected !(root.hasTextField())",
                 (DebugExpression<bool> *)&_kjCondition_5.field_0x27);
      _kjCondition_5._37_1_ = 0;
    }
  }
  value = kj::mv<capnp::Orphan<capnp::Text>>((Orphan<capnp::Text> *)local_170);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptTextField((Builder *)local_128,value);
  local_288 = (Orphan<capnp::Text> *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (Orphan<capnp::Text> *)local_170);
  pvStack_290 = (void *)0x0;
  kj::_::DebugExpression<capnp::Orphan<capnp::Text>&>::operator==
            ((DebugComparison<capnp::Orphan<capnp::Text>_&,_std::nullptr_t> *)local_280,
             (DebugExpression<capnp::Orphan<capnp::Text>&> *)&local_288,&stack0xfffffffffffffd70);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_280);
  if (!bVar1) {
    _kjCondition_7._55_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_7._55_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnp::Text>&,decltype(nullptr)>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x94,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
                 (char (*) [35])"failed: expected orphan == nullptr",
                 (DebugComparison<capnp::Orphan<capnp::Text>_&,_std::nullptr_t> *)local_280);
      _kjCondition_7._55_1_ = 0;
    }
  }
  _kjCondition_7._53_1_ =
       capnproto_test::capnp::test::TestAllTypes::Builder::hasTextField((Builder *)local_128);
  _kjCondition_7._54_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_7.field_0x35);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_7.field_0x36);
  if (!bVar1) {
    _kjCondition_7._52_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_7._52_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x95,ERROR,"\"failed: expected \" \"root.hasTextField()\", _kjCondition",
                 (char (*) [37])"failed: expected root.hasTextField()",
                 (DebugExpression<bool> *)&_kjCondition_7.field_0x36);
      _kjCondition_7._52_1_ = 0;
    }
  }
  local_2d8 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            ((Builder *)local_2f0,(Builder *)local_128);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_2d0,
             (DebugExpression<char_const(&)[4]> *)&local_2d8,(Builder *)local_2f0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2d0);
  if (!bVar1) {
    local_2f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2f1 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                (&local_310,(Builder *)local_128);
      kj::_::Debug::
      log<char_const(&)[50],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x96,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (root.getTextField())\", _kjCondition, \"foo\", root.getTextField()"
                 ,(char (*) [50])"failed: expected (\"foo\") == (root.getTextField())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_2d0,
                 (char (*) [4])"foo",&local_310);
      local_2f1 = false;
    }
  }
  Orphan<capnp::Text>::~Orphan((Orphan<capnp::Text> *)local_170);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Orphans, Text) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  root.setTextField("foo");
  EXPECT_TRUE(root.hasTextField());

  Orphan<Text> orphan = root.disownTextField();
  EXPECT_FALSE(orphan == nullptr);

  EXPECT_EQ("foo", orphan.getReader());
  EXPECT_EQ("foo", orphan.get());
  EXPECT_FALSE(root.hasTextField());

  root.adoptTextField(kj::mv(orphan));
  EXPECT_TRUE(orphan == nullptr);
  EXPECT_TRUE(root.hasTextField());
  EXPECT_EQ("foo", root.getTextField());
}